

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O1

void LiteScript::StateExecutor::I_ARRAY_PUSH_LITERAL(State *state,Instruction *instr)

{
  pointer pVVar1;
  bool bVar2;
  Object *pOVar3;
  Type *this;
  Variable v1;
  Variable v2;
  Variable local_50;
  Variable local_40;
  Variable local_30;
  Variable local_20;
  
  state->line_num = state->line_num + 1;
  pVVar1 = (state->op_lifo).
           super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((0x10 < (ulong)((long)pVVar1 -
                     (long)(state->op_lifo).
                           super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                           ._M_impl.super__Vector_impl_data._M_start)) &&
     (instr->comp_type == '\x04')) {
    Variable::Variable(&local_30,pVVar1 + -1);
    PopValue(state);
    Variable::Variable(&local_50,
                       (state->op_lifo).
                       super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                       ._M_impl.super__Vector_impl_data._M_finish + -1);
    pOVar3 = Variable::operator->(&local_50);
    this = Object::GetType(pOVar3);
    bVar2 = Type::operator!=(this,(Type *)_type_array);
    if (!bVar2) {
      pOVar3 = Variable::operator->(&local_50);
      Array::operator[]((Array *)&local_40,(char *)pOVar3->data);
      Variable::operator=(&local_20,&local_40);
      Variable::~Variable(&local_20);
      Variable::~Variable(&local_40);
    }
    Variable::~Variable(&local_50);
    Variable::~Variable(&local_30);
  }
  return;
}

Assistant:

void LiteScript::StateExecutor::I_ARRAY_PUSH_LITERAL(State& state, Instruction& instr) {
    state.line_num++;
    if (state.op_lifo.size() < 2 || instr.comp_type != Instruction::CompType::COMP_TYPE_STRING)
        return;
    Variable v2(state.op_lifo.back());
    PopValue(state);
    Variable v1(state.op_lifo.back());
    if (v1->GetType() != Type::ARRAY)
        return;
    v1->GetData<Array>()[instr.comp_value.v_string] = v2;
}